

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
qt_custom_file_engine_handler_create(QString *path)

{
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  const_iterator o;
  undefined8 in_RSI;
  __uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  QAbstractFileEngineHandler *handler;
  add_const_t<QAbstractFileEngineHandlerList> *__range2;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *engine;
  const_iterator __end2;
  const_iterator __begin2;
  QReadLocker locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
  *in_stack_ffffffffffffff68;
  QList<QAbstractFileEngineHandler_*> *in_stack_ffffffffffffff70;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *this;
  const_iterator local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x26d54f);
  if (iVar3 != 0) {
    this = (unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
           &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
    operator()(in_stack_ffffffffffffff68);
    QReadLocker::QReadLocker
              ((QReadLocker *)in_stack_ffffffffffffff70,(QReadWriteLock *)in_stack_ffffffffffffff68)
    ;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>::
    operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
                *)in_stack_ffffffffffffff68);
    local_18.i = (QAbstractFileEngineHandler **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QAbstractFileEngineHandler_*>::begin(in_stack_ffffffffffffff70);
    o = QList<QAbstractFileEngineHandler_*>::end(in_stack_ffffffffffffff70);
    while (bVar2 = QList<QAbstractFileEngineHandler_*>::const_iterator::operator!=(&local_18,o),
          bVar2) {
      in_stack_ffffffffffffff70 =
           (QList<QAbstractFileEngineHandler_*> *)
           QList<QAbstractFileEngineHandler_*>::const_iterator::operator*(&local_18);
      pDVar1 = (in_stack_ffffffffffffff70->d).d;
      *(undefined1 **)
       in_RDI.super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
       _M_t.super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
       .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = &DAT_aaaaaaaaaaaaaaaa;
      (*(*(_func_int ***)&pDVar1->super_QArrayData)[2])
                (in_RDI.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,pDVar1,in_RSI);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                          *)0x26d674);
      if (bVar2) goto LAB_0026d6ee;
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::~unique_ptr
                (this);
      QList<QAbstractFileEngineHandler_*>::const_iterator::operator++(&local_18);
    }
    bVar2 = false;
LAB_0026d6ee:
    QReadLocker::~QReadLocker((QReadLocker *)0x26d6fb);
    if (bVar2 != false) goto LAB_0026d717;
  }
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::
  unique_ptr<std::default_delete<QAbstractFileEngine>,void>
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
LAB_0026d717:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
            )(tuple<QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>)
             in_RDI.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QAbstractFileEngine> qt_custom_file_engine_handler_create(const QString &path)
{
    if (qt_file_engine_handlers_in_use.loadRelaxed()) {
        QReadLocker locker(fileEngineHandlerMutex());

        // check for registered handlers that can load the file
        for (QAbstractFileEngineHandler *handler : std::as_const(*fileEngineHandlers())) {
            if (auto engine = handler->create(path))
                return engine;
        }
    }

    return nullptr;
}